

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void writedata(void)

{
  undefined4 uVar1;
  int iVar2;
  symboltype sVar3;
  datatype dVar4;
  char local_1a [8];
  char label [10];
  float litvalue;
  int i;
  
  fprintf((FILE *)ofp,"_DATA SEGMENT word public \'data\'\n");
  fprintf((FILE *)ofp,"TestResult     dw     ?\n");
  label[6] = '$';
  label[7] = '\0';
  label[8] = '\0';
  label[9] = '\0';
  for (; uVar1 = label._6_4_, iVar2 = tablesize(), (int)uVar1 < iVar2; label._6_4_ = label._6_4_ + 1
      ) {
    sVar3 = symclass(label._6_4_);
    if (((sVar3 == sttempvar) || (sVar3 = symclass(label._6_4_), sVar3 == stvariable)) &&
       (iVar2 = getproc(label._6_4_), iVar2 == 0x23)) {
      getlabel(label._6_4_,local_1a);
      dVar4 = data_class(label._6_4_);
      if (dVar4 == dtinteger) {
        fprintf((FILE *)ofp,"%-10s     dw     ?\n",local_1a);
      }
      else {
        fprintf((FILE *)ofp,"%-10s     dd     ?\n",local_1a);
      }
    }
    else {
      sVar3 = symclass(label._6_4_);
      if ((sVar3 == stliteral) && (dVar4 = data_class(label._6_4_), dVar4 == dtreal)) {
        getlabel(label._6_4_,local_1a);
        label._2_4_ = getrvalue(label._6_4_);
        fprintf((FILE *)ofp,"%-10s     dd     %f\n",(double)(float)label._2_4_,local_1a);
      }
    }
  }
  fprintf((FILE *)ofp,"_DATA ENDS\n\n");
  return;
}

Assistant:

void    writedata(void)
{    
    fprintf(ofp, "_DATA SEGMENT word public \'data\'\n");
    fprintf(ofp, "TestResult     dw     ?\n");
    
    int    i;
    float    litvalue;
    char    label[LABELSIZE];
    
    for (i = NUMTOKENS+2; i < tablesize();  i++)    {
        if ((symclass(i) == sttempvar || symclass(i) == stvariable)
            && getproc(i) == NUMTOKENS+1)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            if (data_class(i) == dtinteger)
                fprintf(ofp, "%-10s     dw     ?\n", label);
            else
                fprintf(ofp, "%-10s     dd     ?\n", label);
        }
        else if (symclass(i) == stliteral
                 && data_class(i) == dtreal)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            litvalue = getrvalue(i);
            fprintf(ofp, "%-10s     dd     %f\n",
                    label, litvalue);
        }
    }
    
    fprintf(ofp, "_DATA ENDS\n\n");
}